

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O1

tommy_tree_node *
tommy_tree_insert_node(undefined1 *cmp,tommy_tree_node *root,tommy_tree_node **let)

{
  long lVar1;
  int iVar2;
  tommy_tree_node *ptVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar3 = *let;
  if (root == (tommy_tree_node *)0x0) {
LAB_0010f3a3:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return ptVar3;
    }
  }
  else {
    iVar2 = (*(code *)cmp)(ptVar3->data,root->data);
    if (iVar2 < 0) {
      ptVar3 = tommy_tree_insert_node(cmp,root->prev,let);
      root->prev = ptVar3;
    }
    else {
      if (iVar2 == 0) {
        *let = root;
        ptVar3 = root;
        goto LAB_0010f3a3;
      }
      ptVar3 = tommy_tree_insert_node(cmp,root->next,let);
      root->next = ptVar3;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      ptVar3 = tommy_tree_balance(root);
      return ptVar3;
    }
  }
  __stack_chk_fail();
}

Assistant:

static tommy_tree_node* tommy_tree_insert_node(tommy_compare_func* cmp, tommy_tree_node* root, tommy_tree_node** let)
{
	int c;

	if (!root)
		return *let;

	c = cmp((*let)->data, root->data);

	if (c < 0) {
		root->prev = tommy_tree_insert_node(cmp, root->prev, let);
		return tommy_tree_balance(root);
	}

	if (c > 0) {
		root->next = tommy_tree_insert_node(cmp, root->next, let);
		return tommy_tree_balance(root);
	}

	/* already present, set the return pointer */
	*let = root;

	return root;
}